

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  Arena *this_00;
  bool bVar1;
  Type TVar2;
  LogMessage *pLVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *elem;
  Extension *pEVar4;
  LogFinisher local_59;
  Extension *extension;
  LogMessage local_50;
  
  bVar1 = MaybeNewExtension(this,*(int *)(descriptor + 0x38),descriptor,&extension);
  if (bVar1) {
    TVar2 = FieldDescriptor::type(descriptor);
    extension->type = (FieldType)TVar2;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(TVar2 & 0xff) * 4) != 10) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xf4);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    pEVar4 = extension;
    extension->is_repeated = true;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      elem = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x18);
      (elem->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      elem = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)Arena::AllocateAligned
                          (this_00,(type_info *)
                                   &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
      (elem->super_RepeatedPtrFieldBase).arena_ = this_00;
      (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      Arena::AddListNode(this_00,elem,
                         arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        );
      pEVar4 = extension;
    }
    (pEVar4->field_0).repeated_string_value = elem;
  }
  else {
    if (extension->is_repeated == false) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xf9);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_REPEATED): "
                         );
      LogFinisher::operator=(&local_59,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)extension->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xf9);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
  }
  return extension;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        ::google::protobuf::Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}